

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O1

void Extra_TestAndPerm(DdManager *ddF,DdNode *bF,DdNode *bG)

{
  DdNode *pDVar1;
  DdManager *dd;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  DdManager *pDVar7;
  DdNode *pDVar8;
  long lVar9;
  long lVar10;
  char *__s;
  timespec ts;
  timespec local_68;
  DdNode *local_58;
  DdNode *local_50;
  DdManager *local_48;
  DdNode *local_40;
  DdManager *local_38;
  
  local_58 = bF;
  Cudd_AutodynDisable(ddF);
  pDVar7 = Cudd_Init(ddF->size,0,0x100,0x40000,0);
  Cudd_ShuffleHeap(pDVar7,ddF->invperm);
  pDVar8 = Extra_TransferLevelByLevel(ddF,pDVar7,bG);
  Cudd_Ref(pDVar8);
  Cudd_ReduceHeap(pDVar7,CUDD_REORDER_SYMM_SIFT,1);
  iVar2 = clock_gettime(3,&local_68);
  if (iVar2 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  local_50 = Cudd_bddAnd(ddF,local_58,bG);
  Cudd_Ref(local_50);
  iVar6 = 3;
  iVar2 = clock_gettime(3,&local_68);
  if (iVar2 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  Abc_Print(iVar6,"%s =","Runtime of Cudd_bddAnd  ");
  Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar10 + lVar9) / 1000000.0);
  Counter = 0;
  iVar2 = clock_gettime(3,&local_68);
  if (iVar2 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  local_40 = pDVar8;
  pDVar8 = Extra_bddAndPermute(ddF,local_58,pDVar7,pDVar8,(int *)0x0);
  Cudd_Ref(pDVar8);
  iVar6 = 3;
  iVar2 = clock_gettime(3,&local_68);
  if (iVar2 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  local_48 = ddF;
  local_38 = pDVar7;
  Abc_Print(iVar6,"%s =","Runtime of new procedure");
  Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar10 + lVar9) / 1000000.0);
  printf("Recursive calls = %d\n",(ulong)(uint)Counter);
  pDVar1 = local_58;
  uVar3 = Cudd_DagSize(local_58);
  uVar4 = Cudd_DagSize(bG);
  uVar5 = Cudd_DagSize(pDVar8);
  iVar2 = Cudd_DagSize(pDVar1);
  iVar6 = Cudd_DagSize(bG);
  printf("|F| =%6d  |G| =%6d  |H| =%6d  |F|*|G| =%9d  ",(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,
         (ulong)(uint)(iVar2 * iVar6));
  pDVar1 = local_50;
  __s = "Result is incorrect.\n";
  if (local_50 == pDVar8) {
    __s = "Result verified.\n";
  }
  puts(__s);
  pDVar7 = local_48;
  Cudd_RecursiveDeref(local_48,pDVar1);
  Cudd_RecursiveDeref(pDVar7,pDVar8);
  dd = local_38;
  Cudd_RecursiveDeref(local_38,local_40);
  Extra_StopManager(dd);
  Cudd_AutodynEnable(pDVar7,CUDD_REORDER_SYMM_SIFT);
  return;
}

Assistant:

void Extra_TestAndPerm( DdManager * ddF, DdNode * bF, DdNode * bG )
{
    DdManager * ddG;
    DdNode * bG2, * bRes1, * bRes2;
    abctime clk;
    // disable variable ordering in ddF
    Cudd_AutodynDisable( ddF );

    // create new BDD manager
    ddG = Cudd_Init( ddF->size, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    // transfer BDD into it
    Cudd_ShuffleHeap( ddG, ddF->invperm );
    bG2 = Extra_TransferLevelByLevel( ddF, ddG, bG );   Cudd_Ref( bG2 );
    // reorder the new manager
    Cudd_ReduceHeap( ddG, CUDD_REORDER_SYMM_SIFT, 1 );

    // compute the result
clk = Abc_Clock();
    bRes1 = Cudd_bddAnd( ddF, bF, bG );                 Cudd_Ref( bRes1 );
Abc_PrintTime( 1, "Runtime of Cudd_bddAnd  ", Abc_Clock() - clk );

    // compute the result
Counter = 0;
clk = Abc_Clock();
    bRes2 = Extra_bddAndPermute( ddF, bF, ddG, bG2, NULL );      Cudd_Ref( bRes2 );
Abc_PrintTime( 1, "Runtime of new procedure", Abc_Clock() - clk );
printf( "Recursive calls = %d\n", Counter );
printf( "|F| =%6d  |G| =%6d  |H| =%6d  |F|*|G| =%9d  ", 
       Cudd_DagSize(bF), Cudd_DagSize(bG), Cudd_DagSize(bRes2), 
       Cudd_DagSize(bF) * Cudd_DagSize(bG) );

    if ( bRes1 == bRes2 )
        printf( "Result verified.\n\n" );
    else
        printf( "Result is incorrect.\n\n" );

    Cudd_RecursiveDeref( ddF, bRes1 );
    Cudd_RecursiveDeref( ddF, bRes2 );
    // quit the new manager
    Cudd_RecursiveDeref( ddG, bG2 );
    Extra_StopManager( ddG );

    // re-enable variable ordering in ddF
    Cudd_AutodynEnable( ddF, CUDD_REORDER_SYMM_SIFT );
}